

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O3

RefNode * __thiscall RefTable::Add(RefTable *this,SQHash mainpos,SQObject *obj)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  RefNode *pRVar3;
  RefNode *pRVar4;
  SQTable *pSVar5;
  SQFloat SVar6;
  undefined4 uVar7;
  SQObjectFlags SVar8;
  undefined3 uVar9;
  
  pRVar3 = this->_freelist;
  pRVar4 = this->_buckets[mainpos];
  SVar2 = (pRVar3->obj).super_SQObject._type;
  pSVar5 = (pRVar3->obj).super_SQObject._unVal.pTable;
  SVar8 = obj->_flags;
  uVar9 = *(undefined3 *)&obj->field_0x5;
  SVar6 = (obj->_unVal).fFloat;
  uVar7 = *(undefined4 *)((long)&obj->_unVal + 4);
  (pRVar3->obj).super_SQObject._type = obj->_type;
  (pRVar3->obj).super_SQObject._flags = SVar8;
  *(undefined3 *)&(pRVar3->obj).super_SQObject.field_0x5 = uVar9;
  (pRVar3->obj).super_SQObject._unVal.fFloat = SVar6;
  *(undefined4 *)((long)&(pRVar3->obj).super_SQObject._unVal + 4) = uVar7;
  if (((pRVar3->obj).super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &(((pRVar3->obj).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  this->_buckets[mainpos] = pRVar3;
  this->_freelist = this->_freelist->next;
  pRVar3->next = pRVar4;
  this->_slotused = this->_slotused + 1;
  return pRVar3;
}

Assistant:

RefTable::RefNode *RefTable::Add(SQHash mainpos,SQObject &obj)
{
    RefNode *t = _buckets[mainpos];
    RefNode *newnode = _freelist;
    newnode->obj = obj;
    _buckets[mainpos] = newnode;
    _freelist = _freelist->next;
    newnode->next = t;
    assert(newnode->refs == 0);
    _slotused++;
    return newnode;
}